

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O3

void __thiscall
helics::udp::UdpServer::UdpServer
          (UdpServer *this,io_context *io_context,string_view interface,uint16_t portNum)

{
  socket *this_00;
  long *str;
  socklen_t __len;
  char *pcVar1;
  char *pcVar2;
  int __oflag;
  sockaddr *__addr;
  error_code __ec;
  long *local_b8 [2];
  long local_a8 [2];
  undefined4 local_98 [8];
  error_code local_78;
  address local_68;
  endpoint local_4c;
  
  pcVar1 = interface._M_str;
  (this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
  super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
  super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->mSocket;
  pcVar2 = pcVar1;
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,io_context,0);
  __len = (socklen_t)pcVar2;
  *(undefined8 *)((long)&(this->mRemoteEndpoint).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->mRemoteEndpoint).impl_.data_ + 0x10) = 0;
  (this->mRemoteEndpoint).impl_.data_.v6.sin6_scope_id = 0;
  *(undefined8 *)&(this->mRemoteEndpoint).impl_.data_ = 2;
  memset(&this->mRecvBuffer,0,0x400);
  *(undefined8 *)&(this->mDataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDataCall).super__Function_base._M_functor + 8) = 0;
  (this->mDataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDataCall)._M_invoker = (_Invoker_type)0x0;
  local_98[0] = 2;
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)local_98,
             __oflag);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,pcVar1,pcVar1 + interface._M_len);
  str = local_b8[0];
  local_78._M_value = 0;
  local_78._M_cat = (error_category *)std::_V2::system_category();
  ::asio::ip::make_address(&local_68,(char *)str,&local_78);
  __ec._4_4_ = 0;
  __ec._M_value = local_78._M_value;
  if (local_78._M_value != 0) {
    __ec._M_cat = local_78._M_cat;
    std::system_error::system_error((system_error *)local_98,__ec);
    ::asio::detail::throw_exception<std::system_error>((system_error *)local_98);
    std::system_error::~system_error((system_error *)local_98);
  }
  ::asio::ip::detail::endpoint::endpoint(&local_4c,&local_68,portNum);
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(int)&local_4c,
             __addr,__len);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  return;
}

Assistant:

UdpServer(asio::io_context& io_context, std::string_view interface, std::uint16_t portNum):
            mSocket(io_context)
        {
            mSocket.open(asio::ip::udp::v4());
            mSocket.bind(
                asio::ip::udp::endpoint(asio::ip::address::from_string(std::string(interface)),
                                        portNum));
        }